

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_ostream.cpp
# Opt level: O2

string * __thiscall
pretty_ostream::get_memory_usage_abi_cxx11_(string *__return_storage_ptr__,pretty_ostream *this)

{
  int iVar1;
  ostream *poVar2;
  ostringstream memory_usage;
  rusage usage;
  long local_218;
  undefined8 local_210 [46];
  rusage local_a0;
  
  iVar1 = getrusage(RUSAGE_SELF,&local_a0);
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
    *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18)) = 4;
    poVar2 = std::ostream::_M_insert<double>((double)local_a0.ru_maxrss * 0.0009765625);
    std::operator<<(poVar2," MB");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(char *)0x0,(allocator *)&local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

string pretty_ostream::get_memory_usage() {
    struct rusage usage;
    if (getrusage(RUSAGE_SELF, &usage) == 0) {
        double memory_usage_in_MB = 0.0;
#ifdef APPLE
        memory_usage_in_MB = usage.ru_maxrss / 1024. / 1024.;  // MB in Apple
#else
        memory_usage_in_MB = usage.ru_maxrss / 1024.;  // MB in linux
#endif
        ostringstream memory_usage;
        memory_usage << setprecision(4) << memory_usage_in_MB << " MB";
        return (memory_usage.str());
    } else {
        return (0);
    }
}